

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_unicode.c
# Opt level: O2

uint32_t C_decode_utf8(C_Parser *tokenizer,char **new_pos,char *p)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  int i;
  
  bVar1 = *p;
  if ((char)bVar1 < '\0') {
    if (bVar1 < 0xf0) {
      if (bVar1 < 0xe0) {
        if (bVar1 < 0xc0) goto LAB_00129deb;
        lVar3 = 2;
        bVar4 = 0x1f;
      }
      else {
        lVar3 = 3;
        bVar4 = 0xf;
      }
    }
    else {
      lVar3 = 4;
      bVar4 = 7;
    }
    uVar2 = (uint)(bVar1 & bVar4);
    if (lVar3 != 1) {
LAB_00129deb:
      C_error_at(tokenizer,p,"invalid UTF-8 sequence");
    }
    *new_pos = p + 1;
  }
  else {
    *new_pos = p + 1;
    uVar2 = (uint)*p;
  }
  return uVar2;
}

Assistant:

uint32_t C_decode_utf8(C_Parser *tokenizer, char **new_pos, char *p) {
  if ((unsigned char)*p < 128) {
    *new_pos = p + 1;
    return *p;
  }

  char *start = p;
  int len;
  uint32_t c;

  if ((unsigned char)*p >= 0b11110000) {
    len = 4;
    c = *p & 0b111;
  } else if ((unsigned char)*p >= 0b11100000) {
    len = 3;
    c = *p & 0b1111;
  } else if ((unsigned char)*p >= 0b11000000) {
    len = 2;
    c = *p & 0b11111;
  } else {
	  C_error_at(tokenizer, start, "invalid UTF-8 sequence");
  }

  for (int i = 1; i < len; i++) {
    if ((unsigned char)p[i] >> 6 != 0b10)
	    C_error_at(tokenizer, start, "invalid UTF-8 sequence");
    c = (c << 6) | (p[i] & 0b111111);
  }

  *new_pos = p + len;
  return c;
}